

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

void __thiscall
helics::CloningFilter::CloningFilter(CloningFilter *this,Federate *ffed,string_view filtName)

{
  string_view filtName_00;
  string_view inputType;
  string_view filterName;
  Interface *this_00;
  size_t in_RCX;
  Federate *in_RDX;
  char *in_RSI;
  char *in_RDI;
  string_view in_stack_00000000;
  shared_ptr<helics::CloneFilterOperation> *in_stack_ffffffffffffff28;
  shared_ptr<helics::FilterOperations> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Filter *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  InterfaceHandle ihandle;
  shared_ptr<helics::FilterOperations> *in_stack_ffffffffffffff68;
  Filter *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58 [2];
  BaseType local_38;
  InterfaceHandle local_34;
  char *pcVar1;
  char *pcVar2;
  Federate *pFVar3;
  
  ihandle.hid = (BaseType)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  pcVar1 = in_RSI;
  pcVar2 = in_RDI;
  pFVar3 = in_RDX;
  memset(&local_34,0,4);
  InterfaceHandle::InterfaceHandle(&local_34);
  filtName_00._M_str = in_RDI;
  filtName_00._M_len = (size_t)in_RSI;
  Filter::Filter(in_stack_ffffffffffffff48,
                 (Federate *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 filtName_00,ihandle);
  *(undefined ***)in_RDI = &PTR__CloningFilter_00a40668;
  if (pcVar1 != (char *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_58);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68);
    filterName._M_str = (char *)pFVar3;
    filterName._M_len = (size_t)pcVar2;
    inputType._M_str = pcVar1;
    inputType._M_len = in_RCX;
    this_00 = (Interface *)
              Federate::registerCloningFilter(in_RDX,filterName,inputType,in_stack_00000000);
    local_38 = (BaseType)Interface::operator_cast_to_InterfaceHandle(this_00);
    *(BaseType *)(in_RDI + 0x10) = local_38;
    in_stack_ffffffffffffff28 = (shared_ptr<helics::CloneFilterOperation> *)local_68._M_len;
    in_stack_ffffffffffffff30 = (shared_ptr<helics::FilterOperations> *)local_68._M_str;
  }
  std::make_shared<helics::CloneFilterOperation>();
  std::shared_ptr<helics::FilterOperations>::shared_ptr<helics::CloneFilterOperation,void>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Filter::setFilterOperations(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::shared_ptr<helics::FilterOperations>::~shared_ptr
            ((shared_ptr<helics::FilterOperations> *)0x2cffa2);
  std::shared_ptr<helics::CloneFilterOperation>::~shared_ptr
            ((shared_ptr<helics::CloneFilterOperation> *)0x2cffac);
  return;
}

Assistant:

CloningFilter::CloningFilter(Federate* ffed, std::string_view filtName):
    Filter(ffed, filtName, InterfaceHandle())
{
    if (ffed != nullptr) {
        handle = ffed->registerCloningFilter(filtName);
    }
    setFilterOperations(std::make_shared<CloneFilterOperation>());
}